

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds2.cpp
# Opt level: O3

bool ReadDS2(MemFile *file,shared_ptr<Disk> *disk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  pointer puVar4;
  element_type *peVar5;
  char extraout_AL;
  bool bVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  Data *pDVar10;
  exception *this;
  FILE *__stream;
  Data data;
  string path;
  MemFile file2;
  Format fmt;
  allocator_type local_119;
  string local_118;
  string local_f8;
  MemFile local_d8;
  Format local_6c;
  
  psVar9 = MemFile::path_abi_cxx11_(file);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  pcVar3 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,pcVar3 + psVar9->_M_string_length);
  paVar1 = &local_d8.m_path.field_2;
  local_d8.m_path._M_string_length = 0;
  local_d8.m_path.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_d8.m_filename.field_2;
  local_d8.m_filename._M_string_length = 0;
  local_d8.m_filename.field_2._M_local_buf[0] = '\0';
  local_d8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.m_it._M_current = (uchar *)0x0;
  local_d8.m_compress = None;
  __stream = (FILE *)0x0;
  local_d8.m_path._M_dataplus._M_p = (pointer)paVar1;
  local_d8.m_filename._M_dataplus._M_p = (pointer)paVar2;
  Format::Format(&local_6c,MGT);
  MemFile::rewind(file,__stream);
  if (extraout_AL != '\0') {
    iVar7 = MemFile::size(file);
    iVar8 = Format::disk_size(&local_6c);
    if (iVar7 == iVar8 / 2) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"dsk","");
      bVar6 = IsFileExt(&local_f8,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        local_f8._M_dataplus._M_p[local_f8._M_string_length - 1] = '2';
        MemFile::open(&local_d8,(char *)&local_f8,1);
        iVar7 = MemFile::size(&local_d8);
        iVar8 = Format::disk_size(&local_6c);
        if (iVar7 != iVar8 / 2) {
          this = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<std::__cxx11::string&,char_const(&)[24]>
                    (this,&local_f8,(char (*) [24])" file size is incorrect");
          __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pDVar10 = MemFile::data(file);
        __first._M_current =
             (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pDVar10 = MemFile::data(file);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,__first,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_119);
        pDVar10 = MemFile::data(&local_d8);
        puVar4 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pDVar10 = MemFile::data(&local_d8);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,
                   local_118._M_string_length,puVar4,
                   (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        Disk::format((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&local_6c,
                     (Data *)&local_118,true);
        peVar5 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__cxx11::string::_M_replace
                  ((ulong)&peVar5->strType,0,(char *)(peVar5->strType)._M_string_length,0x1b0dab);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_118._M_dataplus._M_p,
                          local_118.field_2._M_allocated_capacity - (long)local_118._M_dataplus._M_p
                         );
        }
        bVar6 = true;
        goto LAB_0018b5ee;
      }
    }
  }
  bVar6 = false;
LAB_0018b5ee:
  if (local_d8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.m_data.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8.m_filename._M_dataplus._M_p,
                    CONCAT71(local_d8.m_filename.field_2._M_allocated_capacity._1_7_,
                             local_d8.m_filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8.m_path._M_dataplus._M_p,
                    CONCAT71(local_d8.m_path.field_2._M_allocated_capacity._1_7_,
                             local_d8.m_path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool ReadDS2(MemFile& file, std::shared_ptr<Disk>& disk)
{
    std::string path = file.path();
    MemFile file2;

    Format fmt{ RegularFormat::MGT };

    // The input should be half a standard SAM disk in size
    if (!file.rewind() || file.size() != fmt.disk_size() / 2)
        return false;

    // Require the supplied file be head 0
    if (!IsFileExt(path, "dsk"))
        return false;

    // DSK->DS2
    size_t offset = path.length() - 1;
    path[offset] = '2';

    // The DS2 file must also be present
    try {
        file2.open(path);
    }
    catch (...) {
        return false;
    }

    // The companion file should also contain a single side
    if (file2.size() != fmt.disk_size() / 2)
        throw util::exception(path, " file size is incorrect");

    // Join the sides
    Data data(file.data().begin(), file.data().end());
    data.insert(data.end(), file2.data().begin(), file2.data().end());

    disk->format(fmt, data, true);
    disk->strType = "DS2";

    return true;
}